

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::estimateTopLevelItems(QGraphicsSceneIndex *this,QRectF *rect,SortOrder order)

{
  QGraphicsSceneIndexPrivate *this_00;
  QGraphicsScenePrivate *pQVar1;
  qsizetype qVar2;
  int in_ECX;
  QList<QGraphicsItem_*> *in_RDI;
  qsizetype in_stack_00000018;
  int i;
  int numTopLevelItems;
  QGraphicsScenePrivate *scened;
  QGraphicsSceneIndexPrivate *d;
  QList<QGraphicsItem_*> *sorted;
  parameter_type in_stack_ffffffffffffffa8;
  QList<QGraphicsItem_*> *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  
  this_01 = in_RDI;
  this_00 = d_func((QGraphicsSceneIndex *)0xa27f32);
  pQVar1 = QGraphicsScene::d_func((QGraphicsScene *)0xa27f45);
  QGraphicsScenePrivate::ensureSortedTopLevelItems
            ((QGraphicsScenePrivate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
  ;
  if (in_ECX == 1) {
    (this_01->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (this_01->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    (this_01->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa27f8e);
    qVar2 = QList<QGraphicsItem_*>::size(&pQVar1->topLevelItems);
    iVar3 = (int)qVar2;
    QList<QGraphicsItem_*>::reserve((QList<QGraphicsItem_*> *)this_00,in_stack_00000018);
    while (iVar3 = iVar3 + -1, -1 < iVar3) {
      QList<QGraphicsItem_*>::at(this_01,(qsizetype)in_stack_ffffffffffffffa8);
      QList<QGraphicsItem_*>::operator<<(this_01,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QList<QGraphicsItem_*>::QList(this_01,(QList<QGraphicsItem_*> *)in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::estimateTopLevelItems(const QRectF &rect, Qt::SortOrder order) const
{
    Q_D(const QGraphicsSceneIndex);
    Q_UNUSED(rect);
    QGraphicsScenePrivate *scened = d->scene->d_func();
    scened->ensureSortedTopLevelItems();
    if (order == Qt::DescendingOrder) {
        QList<QGraphicsItem *> sorted;
        const int numTopLevelItems = scened->topLevelItems.size();
        sorted.reserve(numTopLevelItems);
        for (int i = numTopLevelItems - 1; i >= 0; --i)
            sorted << scened->topLevelItems.at(i);
        return sorted;
    }
    return scened->topLevelItems;
}